

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcDraughtingCallout::IfcDraughtingCallout(IfcDraughtingCallout *this)

{
  *(undefined ***)&this->field_0x48 = &PTR__Object_007a99b0;
  *(undefined8 *)&this->field_0x50 = 0;
  *(char **)&this->field_0x58 = "IfcDraughtingCallout";
  IfcGeometricRepresentationItem::IfcGeometricRepresentationItem
            (&this->super_IfcGeometricRepresentationItem,&PTR_construction_vtable_24__007d0768);
  *(undefined8 *)&(this->super_IfcGeometricRepresentationItem).field_0x28 = 0;
  (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x7d06d8;
  *(undefined8 *)&this->field_0x48 = 0x7d0750;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x7d0700;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x7d0728;
  *(undefined8 *)&(this->super_IfcGeometricRepresentationItem).field_0x30 = 0;
  *(undefined8 *)&this->field_0x38 = 0;
  *(undefined8 *)&this->field_0x40 = 0;
  return;
}

Assistant:

IfcDraughtingCallout() : Object("IfcDraughtingCallout") {}